

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall QDockWidgetLayout::setGeometry(QDockWidgetLayout *this,QRect *geometry)

{
  QList<QLayoutItem_*> *this_00;
  long lVar1;
  QLayoutItem *pQVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  QWidget *pQVar10;
  QStyle *pQVar11;
  pointer ppQVar12;
  int iVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 local_a8 [16];
  QStyleOptionDockWidget opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = QLayout::parentWidget(&this->super_QLayout);
  pQVar10 = &QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&pQVar10->super_QObject)->
             super_QWidget;
  bVar7 = nativeWindowDeco(this);
  iVar8 = 0;
  if ((!bVar7) &&
     (((pQVar10->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    pQVar11 = QWidget::style(pQVar10);
    iVar8 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x12,0,pQVar10);
  }
  if (bVar7) {
    ppQVar12 = QList<QLayoutItem_*>::data(&this->item_list);
    pQVar2 = *ppQVar12;
    if (pQVar2 != (QLayoutItem *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        (*pQVar2->_vptr_QLayoutItem[6])(pQVar2,geometry);
        return;
      }
      goto LAB_003d55f4;
    }
  }
  else {
    iVar9 = titleHeight(this);
    if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
      iVar13 = iVar9 + iVar8 + -1;
      iVar9 = ((geometry->y2).m_i - iVar8) - (geometry->y1).m_i;
    }
    else {
      iVar13 = ((geometry->x2).m_i - iVar8) - (geometry->x1).m_i;
      iVar9 = iVar9 + iVar8 + -1;
    }
    (this->_titleArea).x1.m_i = iVar8;
    (this->_titleArea).y1.m_i = iVar8;
    (this->_titleArea).x2.m_i = iVar13;
    (this->_titleArea).y2.m_i = iVar9;
    this_00 = &this->item_list;
    ppQVar12 = QList<QLayoutItem_*>::data(this_00);
    pQVar2 = ppQVar12[3];
    if (pQVar2 == (QLayoutItem *)0x0) {
      opt.title.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      opt._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.title.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      opt.title.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionDockWidget::QStyleOptionDockWidget(&opt);
      (**(code **)(*(long *)pQVar10 + 0x1a0))(pQVar10,&opt);
      ppQVar12 = QList<QLayoutItem_*>::data(this_00);
      pQVar2 = ppQVar12[1];
      if (pQVar2 != (QLayoutItem *)0x0) {
        iVar9 = (*pQVar2->_vptr_QLayoutItem[8])(pQVar2);
        if ((char)iVar9 == '\0') {
          pQVar11 = QWidget::style(pQVar10);
          local_a8 = (**(code **)(*(long *)pQVar11 + 0xc0))(pQVar11,0x1c,&opt,pQVar10);
          if ((local_a8._0_4_ + -1 != local_a8._8_4_) || (local_a8._4_4_ + -1 != local_a8._12_4_)) {
            (*pQVar2->_vptr_QLayoutItem[6])(pQVar2,local_a8);
          }
        }
      }
      ppQVar12 = QList<QLayoutItem_*>::data(this_00);
      pQVar2 = ppQVar12[2];
      if (pQVar2 != (QLayoutItem *)0x0) {
        iVar9 = (*pQVar2->_vptr_QLayoutItem[8])(pQVar2);
        if ((char)iVar9 == '\0') {
          pQVar11 = QWidget::style(pQVar10);
          auVar14 = (**(code **)(*(long *)pQVar11 + 0xc0))(pQVar11,0x1d,&opt,pQVar10);
          local_a8 = auVar14;
          if ((auVar14._0_4_ + -1 != auVar14._8_4_) || (auVar14._4_4_ + -1 != auVar14._12_4_)) {
            (*pQVar2->_vptr_QLayoutItem[6])(pQVar2,local_a8);
          }
        }
      }
      QStyleOptionDockWidget::~QStyleOptionDockWidget(&opt);
    }
    else {
      (*pQVar2->_vptr_QLayoutItem[6])(pQVar2,&this->_titleArea);
    }
    ppQVar12 = QList<QLayoutItem_*>::data(this_00);
    if (*ppQVar12 != (QLayoutItem *)0x0) {
      uVar3 = geometry->x1;
      uVar4 = geometry->y1;
      uVar5 = geometry->x2;
      uVar6 = geometry->y2;
      if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
        opt.super_QStyleOption.version = (this->_titleArea).x2.m_i + 1;
        opt.super_QStyleOption.type = uVar4 + iVar8;
      }
      else {
        opt.super_QStyleOption.type = (this->_titleArea).y2.m_i + 1;
        opt.super_QStyleOption.version = uVar3 + iVar8;
      }
      opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)(uVar5 - iVar8);
      opt.super_QStyleOption.direction = uVar6 - iVar8;
      (*(*ppQVar12)->_vptr_QLayoutItem[6])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_003d55f4:
  __stack_chk_fail();
}

Assistant:

void QDockWidgetLayout::setGeometry(const QRect &geometry)
{
    QDockWidget *q = qobject_cast<QDockWidget*>(parentWidget());

    bool nativeDeco = nativeWindowDeco();

    int fw = q->isFloating() && !nativeDeco
            ? q->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, q)
            : 0;

    if (nativeDeco) {
        if (QLayoutItem *item = item_list[Content])
            item->setGeometry(geometry);
    } else {
        int titleHeight = this->titleHeight();

        if (verticalTitleBar) {
            _titleArea = QRect(QPoint(fw, fw),
                                QSize(titleHeight, geometry.height() - (fw * 2)));
        } else {
            _titleArea = QRect(QPoint(fw, fw),
                                QSize(geometry.width() - (fw * 2), titleHeight));
        }

        if (QLayoutItem *item = item_list[TitleBar]) {
            item->setGeometry(_titleArea);
        } else {
            QStyleOptionDockWidget opt;
            q->initStyleOption(&opt);

            if (QLayoutItem *item = item_list[CloseButton]) {
                if (!item->isEmpty()) {
                    QRect r = q->style()
                        ->subElementRect(QStyle::SE_DockWidgetCloseButton,
                                            &opt, q);
                    if (!r.isNull())
                        item->setGeometry(r);
                }
            }

            if (QLayoutItem *item = item_list[FloatButton]) {
                if (!item->isEmpty()) {
                    QRect r = q->style()
                        ->subElementRect(QStyle::SE_DockWidgetFloatButton,
                                            &opt, q);
                    if (!r.isNull())
                        item->setGeometry(r);
                }
            }
        }

        if (QLayoutItem *item = item_list[Content]) {
            QRect r = geometry;
            if (verticalTitleBar) {
                r.setLeft(_titleArea.right() + 1);
                r.adjust(0, fw, -fw, -fw);
            } else {
                r.setTop(_titleArea.bottom() + 1);
                r.adjust(fw, 0, -fw, -fw);
            }
            item->setGeometry(r);
        }
    }
}